

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeInit(void *cvode_mem,CVRhsFn f,sunrealtype t0,N_Vector y0)

{
  uint uVar1;
  sunrealtype *psVar2;
  N_Vector *pp_Var3;
  CVodeMem cv_mem_00;
  N_Vector in_RDX;
  CVRhsFn in_RSI;
  CVodeMem in_RDI;
  sunrealtype in_XMM0_Qa;
  SUNNonlinearSolver NLS;
  int retval;
  int k;
  int i;
  sunindextype liw1;
  sunindextype lrw1;
  int allocOK;
  int nvectorOK;
  CVodeMem cv_mem;
  CVodeMem in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar5;
  sunindextype local_48;
  sunindextype local_40;
  int local_38;
  int local_34;
  CVodeMem local_30;
  N_Vector local_28;
  sunrealtype local_20;
  CVRhsFn local_18;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x2b1,"CVodeInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDX == (N_Vector)0x0) {
    cvProcessError(in_RDI,-0x16,700,"CVodeInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"y0 = NULL illegal.");
    local_4 = -0x16;
  }
  else if (in_RSI == (CVRhsFn)0x0) {
    cvProcessError(in_RDI,-0x16,0x2c4,"CVodeInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"f = NULL illegal.");
    local_4 = -0x16;
  }
  else {
    local_30 = in_RDI;
    local_28 = in_RDX;
    local_20 = in_XMM0_Qa;
    local_18 = in_RSI;
    local_34 = cvCheckNvector(in_RDX);
    if (local_34 == 0) {
      cvProcessError(local_30,-0x16,0x2cf,"CVodeInit",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"A required vector operation is not implemented.");
      local_4 = -0x16;
    }
    else {
      if (local_28->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        local_40 = 0;
        local_48 = 0;
      }
      else {
        N_VSpace(local_28,&local_40,&local_48);
      }
      local_30->cv_lrw1 = local_40;
      local_30->cv_liw1 = local_48;
      local_38 = cvAllocVectors((CVodeMem)
                                CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                (N_Vector)in_stack_ffffffffffffffa0);
      if (local_38 == 0) {
        cvProcessError(local_30,-0x14,0x2e5,"CVodeInit",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                       ,"A memory request failed.");
        local_4 = -0x14;
      }
      else {
        local_30->cv_cvals = (sunrealtype *)0x0;
        psVar2 = (sunrealtype *)malloc(0x68);
        local_30->cv_cvals = psVar2;
        local_30->cv_Xvecs = (N_Vector *)0x0;
        pp_Var3 = (N_Vector *)malloc(0x68);
        local_30->cv_Xvecs = pp_Var3;
        local_30->cv_Zvecs = (N_Vector *)0x0;
        pp_Var3 = (N_Vector *)malloc(0x68);
        local_30->cv_Zvecs = pp_Var3;
        if (((local_30->cv_cvals == (sunrealtype *)0x0) || (local_30->cv_Xvecs == (N_Vector *)0x0))
           || (local_30->cv_Zvecs == (N_Vector *)0x0)) {
          cvFreeVectors(in_stack_ffffffffffffffa0);
          cvProcessError(local_30,-0x14,0x2f9,"CVodeInit",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                         ,"A memory request failed.");
          local_4 = -0x14;
        }
        else {
          local_30->cv_f = local_18;
          local_30->cv_tn = local_20;
          N_VScale(0x3ff0000000000000,local_28,local_30->cv_zn[0]);
          cv_mem_00 = (CVodeMem)
                      SUNNonlinSol_Newton((N_Vector)
                                          CONCAT44(in_stack_ffffffffffffffb4,
                                                   in_stack_ffffffffffffffb0),
                                          (SUNContext)
                                          CONCAT44(in_stack_ffffffffffffffac,
                                                   in_stack_ffffffffffffffa8));
          if (cv_mem_00 == (CVodeMem)0x0) {
            cvProcessError(local_30,-0x14,0x30e,"CVodeInit",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                           ,"A memory request failed.");
            cvFreeVectors(cv_mem_00);
            local_4 = -0x14;
          }
          else {
            uVar1 = CVodeSetNonlinearSolver
                              ((void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                               ,(SUNNonlinearSolver)cv_mem_00);
            if (uVar1 == 0) {
              local_30->ownNLS = 1;
              local_30->cv_q = 1;
              local_30->cv_L = 2;
              local_30->cv_qwait = local_30->cv_L;
              local_30->cv_etamax = local_30->cv_eta_max_fs;
              local_30->cv_qu = 0;
              local_30->cv_hu = 0.0;
              local_30->cv_tolsf = 1.0;
              local_30->cv_linit = (_func_int_CVodeMemRec_ptr *)0x0;
              local_30->cv_lsetup =
                   (_func_int_CVodeMemRec_ptr_int_N_Vector_N_Vector_int_ptr_N_Vector_N_Vector_N_Vector
                    *)0x0;
              local_30->cv_lsolve =
                   (_func_int_CVodeMemRec_ptr_N_Vector_N_Vector_N_Vector_N_Vector *)0x0;
              local_30->cv_lfree = (_func_int_CVodeMemRec_ptr *)0x0;
              local_30->cv_lmem = (void *)0x0;
              local_30->cv_forceSetup = 0;
              local_30->cv_nst = 0;
              local_30->cv_nfe = 0;
              local_30->cv_ncfn = 0;
              local_30->cv_netf = 0;
              local_30->cv_nni = 0;
              local_30->cv_nnf = 0;
              local_30->cv_nsetups = 0;
              local_30->cv_nhnil = 0;
              local_30->cv_nstlp = 0;
              local_30->cv_nscon = 0;
              local_30->cv_nge = 0;
              local_30->cv_irfnd = 0;
              local_30->cv_h0u = 0.0;
              local_30->cv_next_h = 0.0;
              local_30->cv_next_q = 0;
              local_30->cv_nor = 0;
              for (iVar5 = 1; iVar5 < 6; iVar5 = iVar5 + 1) {
                for (iVar4 = 1; iVar4 < 4; iVar4 = iVar4 + 1) {
                  local_30->cv_ssdat[iVar5 + -1][iVar4 + -1] = 0.0;
                }
              }
              local_30->cv_MallocDone = 1;
              local_4 = 0;
            }
            else {
              cvProcessError(local_30,(int)(ulong)uVar1,0x31b,"CVodeInit",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                             ,"Setting the nonlinear solver failed");
              cvFreeVectors(cv_mem_00);
              SUNNonlinSolFree(cv_mem_00);
              local_4 = -0x14;
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVodeInit(void* cvode_mem, CVRhsFn f, sunrealtype t0, N_Vector y0)
{
  CVodeMem cv_mem;
  sunbooleantype nvectorOK, allocOK;
  sunindextype lrw1, liw1;
  int i, k, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  SUNDIALS_MARK_FUNCTION_BEGIN(CV_PROFILER);

  /* Check for legal input parameters */

  if (y0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_Y0);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  if (f == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_F);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Test if all required vector operations are implemented */

  nvectorOK = cvCheckNvector(y0);
  if (!nvectorOK)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NVECTOR);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_ILL_INPUT);
  }

  /* Set space requirements for one N_Vector */

  if (y0->ops->nvspace != NULL) { N_VSpace(y0, &lrw1, &liw1); }
  else
  {
    lrw1 = 0;
    liw1 = 0;
  }
  cv_mem->cv_lrw1 = lrw1;
  cv_mem->cv_liw1 = liw1;

  /* Allocate the vectors (using y0 as a template) */

  allocOK = cvAllocVectors(cv_mem, y0);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* Allocate temporary work arrays for fused vector ops */
  cv_mem->cv_cvals = NULL;
  cv_mem->cv_cvals = (sunrealtype*)malloc(L_MAX * sizeof(sunrealtype));

  cv_mem->cv_Xvecs = NULL;
  cv_mem->cv_Xvecs = (N_Vector*)malloc(L_MAX * sizeof(N_Vector));

  cv_mem->cv_Zvecs = NULL;
  cv_mem->cv_Zvecs = (N_Vector*)malloc(L_MAX * sizeof(N_Vector));

  if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
      (cv_mem->cv_Zvecs == NULL))
  {
    cvFreeVectors(cv_mem);
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* Input checks complete at this point and history array allocated */

  /* Copy the input parameters into CVODE state */
  cv_mem->cv_f  = f;
  cv_mem->cv_tn = t0;

  /* Initialize zn[0] in the history array */
  N_VScale(ONE, y0, cv_mem->cv_zn[0]);

  /* create a Newton nonlinear solver object by default */
  NLS = SUNNonlinSol_Newton(y0, cv_mem->cv_sunctx);

  /* check that nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvFreeVectors(cv_mem);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  retval = CVodeSetNonlinearSolver(cv_mem, NLS);

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  cv_mem->ownNLS = SUNTRUE;

  /* All error checking is complete at this point */

  /* Set step parameters */

  cv_mem->cv_q      = 1;
  cv_mem->cv_L      = 2;
  cv_mem->cv_qwait  = cv_mem->cv_L;
  cv_mem->cv_etamax = cv_mem->cv_eta_max_fs;

  cv_mem->cv_qu    = 0;
  cv_mem->cv_hu    = ZERO;
  cv_mem->cv_tolsf = ONE;

  /* Set the linear solver addresses to NULL.
     (We check != NULL later, in CVode) */

  cv_mem->cv_linit  = NULL;
  cv_mem->cv_lsetup = NULL;
  cv_mem->cv_lsolve = NULL;
  cv_mem->cv_lfree  = NULL;
  cv_mem->cv_lmem   = NULL;

  /* Set forceSetup to SUNFALSE */

  cv_mem->cv_forceSetup = SUNFALSE;

  /* Initialize all the counters */

  cv_mem->cv_nst     = 0;
  cv_mem->cv_nfe     = 0;
  cv_mem->cv_ncfn    = 0;
  cv_mem->cv_netf    = 0;
  cv_mem->cv_nni     = 0;
  cv_mem->cv_nnf     = 0;
  cv_mem->cv_nsetups = 0;
  cv_mem->cv_nhnil   = 0;
  cv_mem->cv_nstlp   = 0;
  cv_mem->cv_nscon   = 0;
  cv_mem->cv_nge     = 0;

  cv_mem->cv_irfnd = 0;

  /* Initialize other integrator optional outputs */

  cv_mem->cv_h0u    = ZERO;
  cv_mem->cv_next_h = ZERO;
  cv_mem->cv_next_q = 0;

  /* Initialize Stablilty Limit Detection data */
  /* NOTE: We do this even if stab lim det was not
     turned on yet. This way, the user can turn it
     on at any time */

  cv_mem->cv_nor = 0;
  for (i = 1; i <= 5; i++)
  {
    for (k = 1; k <= 3; k++) { cv_mem->cv_ssdat[i - 1][k - 1] = ZERO; }
  }

  /* Problem has been successfully initialized */

  cv_mem->cv_MallocDone = SUNTRUE;

  SUNDIALS_MARK_FUNCTION_END(CV_PROFILER);
  return (CV_SUCCESS);
}